

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_neg32_riscv32(void *d,void *a,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(int *)((long)d + uVar2) = -*(int *)((long)a + uVar2);
    uVar2 = uVar2 + 4;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_neg32_riscv32_cold_1();
  return;
}

Assistant:

void HELPER(gvec_neg32)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
#ifdef _MSC_VER
        *(uint32_t *)((char *)d + i) = 0U - *(uint32_t *)((char *)a + i);
#else
        *(uint32_t *)((char *)d + i) = -*(uint32_t *)((char *)a + i);
#endif
    }
    clear_high(d, oprsz, desc);
}